

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cc
# Opt level: O3

uintb __thiscall RangeList::longestFit(RangeList *this,Address *addr,uintb maxsize)

{
  _Rb_tree_header *p_Var1;
  AddrSpace *pAVar2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  _Base_ptr p_Var7;
  uintb uVar8;
  
  pAVar2 = addr->base;
  uVar8 = 0;
  if ((pAVar2 != (AddrSpace *)0x0) &&
     ((this->tree)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    p_Var7 = (_Base_ptr)addr->offset;
    p_Var4 = (this->tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var1 = &(this->tree)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    if (p_Var4 != (_Rb_tree_node_base *)0x0) {
      do {
        bVar6 = pAVar2->index < *(int *)(*(long *)(p_Var4 + 1) + 0x60);
        if (pAVar2->index == *(int *)(*(long *)(p_Var4 + 1) + 0x60)) {
          bVar6 = p_Var7 < p_Var4[1]._M_parent;
        }
        if (bVar6 != false) {
          p_Var3 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[bVar6 ^ 1];
      } while (p_Var4 != (_Base_ptr)0x0);
    }
    if ((p_Var3 == (this->tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) ||
       (p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var3), p_Var4[1]._M_left < p_Var7))
    {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      while ((*(AddrSpace **)(p_Var4 + 1) == pAVar2 && (p_Var4[1]._M_parent <= p_Var7))) {
        p_Var5 = (_Base_ptr)((long)&(p_Var4[1]._M_left)->_M_color + 1);
        uVar8 = (long)p_Var5 + (uVar8 - (long)p_Var7);
        if (maxsize <= uVar8) {
          return uVar8;
        }
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
        p_Var7 = p_Var5;
        if ((_Rb_tree_header *)p_Var4 == p_Var1) {
          return uVar8;
        }
      }
    }
  }
  return uVar8;
}

Assistant:

void Range::saveXml(ostream &s) const

{
  s << "<range";
  a_v(s,"space",spc->getName());
  a_v_u(s,"first",first);
  a_v_u(s,"last",last);
  s << "/>\n";
}